

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_escape_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  char *end_local;
  char **begin_local;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *this_local;
  compiler_token_type local_4;
  
  if (*begin == end) {
LAB_0014071a:
    local_4 = token_escape;
  }
  else {
    switch(**begin) {
    case '<':
      *begin = *begin + 1;
      local_4 = token_assert_word_begin;
      break;
    default:
      goto LAB_0014071a;
    case '>':
      *begin = *begin + 1;
      local_4 = token_assert_word_end;
      break;
    case 'A':
      *begin = *begin + 1;
      local_4 = token_assert_begin_sequence;
      break;
    case 'B':
      *begin = *begin + 1;
      local_4 = token_assert_not_word_boundary;
      break;
    case 'E':
      *begin = *begin + 1;
      local_4 = token_quote_meta_end;
      break;
    case 'Q':
      *begin = *begin + 1;
      local_4 = token_quote_meta_begin;
      break;
    case 'Z':
      *begin = *begin + 1;
      local_4 = token_assert_end_sequence;
      break;
    case 'b':
      *begin = *begin + 1;
      local_4 = token_assert_word_boundary;
    }
  }
  return local_4;
}

Assistant:

regex_constants::compiler_token_type get_escape_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        if(begin != end)
        {
            switch(*begin)
            {
            //case BOOST_XPR_CHAR_(char_type, 'a'): ++begin; return token_escape_bell;
            //case BOOST_XPR_CHAR_(char_type, 'c'): ++begin; return token_escape_control;
            //case BOOST_XPR_CHAR_(char_type, 'e'): ++begin; return token_escape_escape;
            //case BOOST_XPR_CHAR_(char_type, 'f'): ++begin; return token_escape_formfeed;
            //case BOOST_XPR_CHAR_(char_type, 'n'): ++begin; return token_escape_newline;
            //case BOOST_XPR_CHAR_(char_type, 't'): ++begin; return token_escape_horizontal_tab;
            //case BOOST_XPR_CHAR_(char_type, 'v'): ++begin; return token_escape_vertical_tab;
            case BOOST_XPR_CHAR_(char_type, 'A'): ++begin; return token_assert_begin_sequence;
            case BOOST_XPR_CHAR_(char_type, 'b'): ++begin; return token_assert_word_boundary;
            case BOOST_XPR_CHAR_(char_type, 'B'): ++begin; return token_assert_not_word_boundary;
            case BOOST_XPR_CHAR_(char_type, 'E'): ++begin; return token_quote_meta_end;
            case BOOST_XPR_CHAR_(char_type, 'Q'): ++begin; return token_quote_meta_begin;
            case BOOST_XPR_CHAR_(char_type, 'Z'): ++begin; return token_assert_end_sequence;
            // Non-standard extension to ECMAScript syntax
            case BOOST_XPR_CHAR_(char_type, '<'): ++begin; return token_assert_word_begin;
            case BOOST_XPR_CHAR_(char_type, '>'): ++begin; return token_assert_word_end;
            default:; // fall-through
            }
        }

        return token_escape;
    }